

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall
BpTree<int>::Insert_Parent(BpTree<int> *this,IndexNode<int> *C,int k,IndexNode<int> *D)

{
  uint N;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  IndexNode<int> *pIVar8;
  ulong uVar9;
  ulong uVar10;
  IndexNode<int> P;
  Ext_IndexNode<int> T;
  IndexNode<int> Q;
  IndexNode<int> local_510;
  IndexNode<int> local_4b0;
  IndexNode<int> local_450;
  IndexNode<int> local_3f0;
  IndexNode<int> local_390;
  IndexNode<int> local_330;
  IndexNode<int> local_2d0;
  IndexNode<int> local_270;
  IndexNode<int> E;
  IndexNode<int> local_1b0;
  IndexNode<int> local_150;
  IndexNode<int> local_f0;
  IndexNode<int> local_90;
  
  IndexNode<int>::IndexNode(&local_150,C);
  Buffer::Lock(&blocks,local_150.self.BlockNum);
  IndexNode<int>::~IndexNode(&local_150);
  IndexNode<int>::IndexNode(&local_1b0,D);
  Buffer::Lock(&blocks,local_1b0.self.BlockNum);
  IndexNode<int>::~IndexNode(&local_1b0);
  IndexNode<int>::IndexNode(&local_90,C);
  IndexNode<int>::~IndexNode(&local_90);
  if (local_90.parent.FileOff == -1) {
    IndexNode<int>::IndexNode(&P,this->N);
    P.NodeState = '0';
    P.parent.BlockNum = -1;
    P.parent.FileOff = -1;
    *P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = k;
    *P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         '1';
    *P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start =
         C->self;
    P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start[1]
         = D->self;
    InsertNode(this,&P);
    C->parent = P.self;
    this->RootAddr = P.self;
    D->parent = P.self;
    IndexNode<int>::IndexNode(&local_270,C);
    UpdateBlock(this,&local_270);
    IndexNode<int>::~IndexNode(&local_270);
    IndexNode<int>::IndexNode(&local_2d0,D);
    UpdateBlock(this,&local_2d0);
    IndexNode<int>::~IndexNode(&local_2d0);
    IndexNode<int>::IndexNode(&local_330,&P);
    UpdateBlock(this,&local_330);
    pIVar8 = &local_330;
  }
  else {
    IndexNode<int>::IndexNode(&P,this->N);
    FindNode(this,C->parent,&P);
    N = this->N;
    if (P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [(long)(int)N + -1].FileOff != -1) {
      Ext_IndexNode<int>::Ext_IndexNode(&T,N);
      for (lVar4 = 0; lVar7 = (long)this->N, lVar4 < lVar7 + -1; lVar4 = lVar4 + 1) {
        T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar4] = P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar4];
        T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [lVar4] = P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4];
        P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [lVar4] = '0';
        T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar4] = P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4];
        P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar4].BlockNum = -1;
        P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar4].FileOff = -1;
      }
      T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [lVar7 + -1] = P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7 + -1];
      iVar1 = this->N;
      P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [(long)iVar1 + -1].BlockNum = -1;
      P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [(long)iVar1 + -1].FileOff = -1;
      iVar1 = this->N;
      T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1].BlockNum = -1;
      T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1].FileOff = -1;
      for (lVar4 = 0;
          (lVar4 <= this->N &&
          (T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar4].FileOff != (C->self).FileOff)); lVar4 = lVar4 + 1) {
      }
      for (lVar7 = 0;
          (lVar7 <= this->N &&
          (T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar7].FileOff != -1)); lVar7 = lVar7 + 1) {
      }
      for (; (int)lVar4 + 1 < lVar7; lVar7 = lVar7 + -1) {
        T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7 + -1] = T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar7 + -2];
        T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7 + -1] = T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar7 + -2];
        T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7 + -1];
      }
      T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      [lVar4] = '1';
      T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar4] = k;
      T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [lVar4 + 1] = D->self;
      IndexNode<int>::IndexNode(&Q,this->N);
      for (lVar7 = 0; iVar1 = this->N / 2, lVar7 < (int)(iVar1 + (uint)(iVar1 * 2 < this->N) + -1);
          lVar7 = lVar7 + 1) {
        P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar7];
        P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
        P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
      }
      P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [lVar7] = T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar7];
      iVar1 = T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7];
      while( true ) {
        iVar2 = this->N;
        iVar3 = (int)lVar7;
        if ((long)iVar2 <= lVar7 + 1) break;
        Q.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [(int)((iVar3 - ((uint)((iVar2 / 2) * 2 < iVar2) + iVar2 / 2)) + 1)] =
             T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar7 + 1];
        iVar2 = this->N / 2;
        Q.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [(int)((iVar3 - ((uint)(iVar2 * 2 < this->N) + iVar2)) + 1)] =
             T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar7 + 1];
        iVar2 = this->N / 2;
        Q.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [(int)((iVar3 - ((uint)(iVar2 * 2 < this->N) + iVar2)) + 1)] =
             T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar7 + 1];
        lVar7 = lVar7 + 1;
      }
      Q.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [(int)((iVar3 - ((uint)((iVar2 / 2) * 2 < iVar2) + iVar2 / 2)) + 1)] =
           T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar7 + 1];
      Q.NodeState = '0';
      InsertNode(this,&Q);
      for (lVar7 = 0;
          (iVar2 = this->N, lVar7 < iVar2 &&
          (Q.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar7].FileOff != -1)); lVar7 = lVar7 + 1) {
        if (Q.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar7].FileOff == (C->self).FileOff) {
          C->parent = Q.self;
        }
        else {
          IndexNode<int>::IndexNode(&E,iVar2);
          FindNode(this,Q.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7],&E);
          E.parent = Q.self;
          IndexNode<int>::IndexNode(&local_f0,&E);
          UpdateBlock(this,&local_f0);
          IndexNode<int>::~IndexNode(&local_f0);
          IndexNode<int>::~IndexNode(&E);
        }
      }
      pIVar8 = &Q;
      if ((int)lVar4 < (int)(iVar2 / 2 + (uint)((iVar2 / 2) * 2 < iVar2) + -1)) {
        pIVar8 = &P;
      }
      D->parent = pIVar8->self;
      IndexNode<int>::IndexNode(&local_4b0,C);
      UpdateBlock(this,&local_4b0);
      IndexNode<int>::~IndexNode(&local_4b0);
      IndexNode<int>::IndexNode(&local_510,D);
      UpdateBlock(this,&local_510);
      IndexNode<int>::~IndexNode(&local_510);
      Insert_Parent(this,&P,iVar1,&Q);
      IndexNode<int>::~IndexNode(&Q);
      Ext_IndexNode<int>::~Ext_IndexNode(&T);
      goto LAB_0012d559;
    }
    uVar5 = 0;
    uVar9 = 0;
    if (0 < (int)N) {
      uVar9 = (ulong)N;
    }
    for (; (uVar6 = uVar9, uVar9 != uVar5 &&
           (uVar6 = uVar5,
           P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar5].FileOff != (C->self).FileOff)); uVar5 = uVar5 + 1) {
    }
    for (uVar5 = 0;
        (uVar10 = uVar9, uVar9 != uVar5 &&
        (uVar10 = uVar5,
        P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [uVar5].FileOff != -1)); uVar5 = uVar5 + 1) {
    }
    lVar4 = (long)((int)uVar6 + 1);
    for (; lVar4 < (long)uVar10; uVar10 = uVar10 - 1) {
      P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      [uVar10 - 1] = P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10 - 2];
      P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar10 - 1] = P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10 - 2];
      P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [uVar10] = P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar10 - 1];
    }
    P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
    [uVar6 & 0xffffffff] = '1';
    P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar6 & 0xffffffff] = k;
    P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
    [lVar4] = D->self;
    P.NodeState = '0';
    D->parent = P.self;
    IndexNode<int>::IndexNode(&local_390,C);
    UpdateBlock(this,&local_390);
    IndexNode<int>::~IndexNode(&local_390);
    IndexNode<int>::IndexNode(&local_3f0,D);
    UpdateBlock(this,&local_3f0);
    IndexNode<int>::~IndexNode(&local_3f0);
    IndexNode<int>::IndexNode(&local_450,&P);
    UpdateBlock(this,&local_450);
    pIVar8 = &local_450;
  }
  IndexNode<int>::~IndexNode(pIVar8);
LAB_0012d559:
  IndexNode<int>::~IndexNode(&P);
  return;
}

Assistant:

void BpTree<K>::Insert_Parent(IndexNode<K>& C, K k, IndexNode<K> & D) {
	this->LockNode(C);
	this->LockNode(D);
	int i, j, pos;
	Addr C_Addr = C.self;
	if (this->IsRoot(C)) {
		IndexNode<K> R(N);		//C������Ǹ�
		R.NodeState = INTERNAL;
		R.parent = { -1, -1 };
		R.k[0] = k;
		R.v[0] = '1';
		R.p[0] = C.self;
		R.p[1] = D.self;

		this->InsertNode(R);
		C.parent = R.self;
		this->RootAddr = R.self;
		D.parent = R.self;
		this->UpdateBlock(C);
		this->UpdateBlock(D);
		this->UpdateBlock(R);
		return;
	}
	//C���Ǹ�
	IndexNode<K> P(N);
	this->FindNode(C.parent, P);
	if (P.p[N - 1].FileOff == -1) {
		for (pos = 0; pos < N && P.p[pos].FileOff != C.self.FileOff; pos++);	//P���п�λ
		for (i = 0; i < N && P.p[i].FileOff != -1; i++);
		for (j = i; j > pos + 1; j--) {
			P.v[j - 1] = P.v[j - 2];
			P.k[j - 1] = P.k[j - 2];
			P.p[j] = P.p[j - 1];
		}
		P.v[pos] = '1';
		P.k[pos] = k;
		P.p[pos + 1] = D.self;
		P.NodeState = INTERNAL;
		//C�ĸ���㲻�øı�
		D.parent = P.self;
		this->UpdateBlock(C);
		this->UpdateBlock(D);
		this->UpdateBlock(P);
		return;
	}
	//Pû�п�λ
	Ext_IndexNode<K> T = Ext_IndexNode<K>(N);
	//����P��T�У�˳�����P
	for (i = 0; i < N-1; i++) {
		T.k[i] = P.k[i];
		T.v[i] = P.v[i];	P.v[i] = '0';
		T.p[i] = P.p[i];	P.p[i] = { -1, -1 };
	}
	T.p[N - 1] = P.p[N - 1];	P.p[N - 1] = { -1, -1 };
	T.p[N] = { -1, -1 };
	//�����µ�һ��
	for (pos = 0; pos < N + 1 && T.p[pos].FileOff != C.self.FileOff; pos++);
	for (i = 0; i < N + 1 && T.p[i].FileOff != -1; i++);
	for (j = i; j > pos+1; j--) {
		T.v[j - 1] = T.v[j - 2];
		T.k[j - 1] = T.k[j - 2];
		T.p[j] = T.p[j - 1];
	}
	T.v[pos] = '1';
	T.k[pos] = k;		//pos�ڲ���P�����Ͳ�Ľ��ѡ˭Ϊ�����
	T.p[pos + 1] = D.self;
	IndexNode<K> Q(N);
	//���¶�P��Q��ֵ
	for (i = 0; i < MIN_POINTS_NONLEAF - 1; i++) {
		P.k[i] = T.k[i];
		P.v[i] = T.v[i];
		P.p[i] = T.p[i];
	}
	P.p[i] = T.p[i];	//i == MIN_POINTS_NONLEAF - 1
	K k2 = T.k[i];
	i++;				//i == MIN_POINTS_NONLEAF
	for (; i < N; i++) {
		Q.k[i - MIN_POINTS_NONLEAF] = T.k[i];
		Q.p[i - MIN_POINTS_NONLEAF] = T.p[i];
		Q.v[i - MIN_POINTS_NONLEAF] = T.v[i];
	}
	Q.p[i - MIN_POINTS_NONLEAF] = T.p[i];	//i == N
	Q.NodeState = INTERNAL;
	this->InsertNode(Q);
	//�Գ�ΪQ���ӽ�㣬�����丸����ַ
	for (i = 0; i < N && Q.p[i].FileOff != -1; i++) {
		if (Q.p[i].FileOff == C.self.FileOff) {
			C.parent = Q.self;
		}
		else {
			IndexNode<K> E(N);
			this->FindNode(Q.p[i], E);
			E.parent = Q.self;
			this->UpdateBlock(E);
		}
	}
	if (pos < MIN_POINTS_NONLEAF - 1) {
		D.parent = P.self;
	}
	else {
		D.parent = Q.self;
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	this->Insert_Parent(P, k2, Q);		//�����ݹ�
}